

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_multi_statemach(Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  _Bool local_39;
  pingpong *ppStack_38;
  _Bool ssldone;
  imap_conn *imapc;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  imapc = (imap_conn *)data->conn;
  ppStack_38 = (pingpong *)&((connectdata *)imapc)->proto;
  p_Stack_20 = done;
  done_local = (_Bool *)data;
  if (((((connectdata *)imapc)->handler->flags & 1) != 0) &&
     ((*(byte *)((long)&((connectdata *)imapc)->proto + 0xfb) & 1) == 0)) {
    local_39 = false;
    CVar1 = Curl_conn_connect(data,0,false,&local_39);
    *(byte *)((long)&ppStack_38[1].sendbuf.toobig + 3) =
         *(byte *)((long)&ppStack_38[1].sendbuf.toobig + 3) & 0xfe | local_39 & 1U;
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if ((local_39 & 1U) == 0) {
      return CURLE_OK;
    }
  }
  conn._4_4_ = 0;
  CVar1 = Curl_pp_statemach((Curl_easy *)done_local,ppStack_38,false,false);
  *p_Stack_20 = (int)ppStack_38[1].sendbuf.allc == 0;
  return CVar1;
}

Assistant:

static CURLcode imap_multi_statemach(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct imap_conn *imapc = &conn->proto.imapc;

  if((conn->handler->flags & PROTOPT_SSL) && !imapc->ssldone) {
    bool ssldone = FALSE;
    result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
    imapc->ssldone = ssldone;
    if(result || !ssldone)
      return result;
  }

  result = Curl_pp_statemach(data, &imapc->pp, FALSE, FALSE);
  *done = (imapc->state == IMAP_STOP) ? TRUE : FALSE;

  return result;
}